

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

Array2D<double> * __thiscall
pbrt::Array2D<double>::operator=(Array2D<double> *this,Array2D<double> *other)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  Bounds2<int> *in_RSI;
  Array2D<double> *in_RDI;
  int i_2;
  int no;
  int i_1;
  int n_1;
  int i;
  int n;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  int local_18;
  
  bVar1 = pstd::pmr::operator==
                    ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    pstd::swap<pbrt::Bounds2<int>>(&in_RDI->extent,in_RSI);
    pstd::swap<double*>(&in_RDI->values,(double **)&in_RSI[1].pMax);
  }
  else {
    bVar1 = Bounds2<int>::operator==
                      ((Bounds2<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                       ,(Bounds2<int> *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::destroy<double>
                  (&in_RDI->allocator,in_RDI->values + local_18);
        pstd::pmr::polymorphic_allocator<std::byte>::construct<double,double&>
                  (&in_RDI->allocator,in_RDI->values + local_18,
                   (double *)
                   ((long)in_RSI[1].pMax.super_Tuple2<pbrt::Point2,_int> + (long)local_18 * 8));
      }
      (in_RDI->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (in_RSI->pMin).super_Tuple2<pbrt::Point2,_int>;
      (in_RDI->extent).pMax.super_Tuple2<pbrt::Point2,_int> =
           (in_RSI->pMax).super_Tuple2<pbrt::Point2,_int>;
    }
    else {
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::destroy<double>
                  (&in_RDI->allocator,in_RDI->values + iVar4);
      }
      pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<double>
                ((polymorphic_allocator<std::byte> *)in_RDI,(double *)in_stack_ffffffffffffffc8,
                 0x71009c);
      iVar2 = Bounds2<int>::Area(&in_RDI->extent);
      pdVar3 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<double>
                         ((polymorphic_allocator<std::byte> *)in_RDI,
                          (size_t)in_stack_ffffffffffffffc8);
      in_RDI->values = pdVar3;
      for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
        pstd::pmr::polymorphic_allocator<std::byte>::construct<double,double&>
                  (&in_RDI->allocator,in_RDI->values + iVar4,
                   (double *)
                   ((long)in_RSI[1].pMax.super_Tuple2<pbrt::Point2,_int> + (long)iVar4 * 8));
      }
    }
  }
  return in_RDI;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }